

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cc
# Opt level: O0

char * Varint::Skip32BackwardSlow(char *p,char *b)

{
  int local_34;
  int i;
  uchar *base;
  uchar *ptr;
  char *b_local;
  char *p_local;
  
  if (p < b) {
    __assert_fail("ptr >= base",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/varint.cc"
                  ,0xf4,"static const char *Varint::Skip32BackwardSlow(const char *, const char *)")
    ;
  }
  if ((p != b) && ((byte)p[-1] < 0x80)) {
    base = (uchar *)(p + -1);
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      if (base == (uchar *)b) {
        return (char *)base;
      }
      if (base[-1] < 0x80) {
        return (char *)base;
      }
      base = base + -1;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* Varint::Skip32BackwardSlow(const char* p, const char* b) {
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  const unsigned char* base = reinterpret_cast<const unsigned char*>(b);
  assert(ptr >= base);

  // If the initial pointer is at the base or if the previous byte is not
  // the last byte of a varint, we return nullptr since there is nothing to
  // skip.
  if (ptr == base) return nullptr;
  if (*(--ptr) > 127) return nullptr;

  for (int i = 0; i < 5; i++) {
    if (ptr == base)    return reinterpret_cast<const char*>(ptr);
    if (*(--ptr) < 128) return reinterpret_cast<const char*>(ptr + 1);
  }

  return nullptr; // value is too long to be a varint32
}